

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_roaring64_iterate_multi_roaring(void)

{
  undefined1 uVar1;
  bool bVar2;
  anon_class_1_0_00000001 iterate_func;
  uint64_t iterate_count;
  Roaring64Map roaring;
  int in_stack_ffffffffffffff9c;
  int iVar3;
  Roaring64Map *this;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  __0 in_stack_ffffffffffffffaf;
  Roaring64Map *in_stack_ffffffffffffffb0;
  unsigned_long result;
  void *in_stack_ffffffffffffffc0;
  roaring_iterator64 in_stack_ffffffffffffffc8;
  Roaring64Map *in_stack_ffffffffffffffd0;
  
  this = (Roaring64Map *)&stack0xffffffffffffffc8;
  ::roaring::Roaring64Map::Roaring64Map(this);
  uVar1 = ::roaring::Roaring64Map::addChecked
                    (in_stack_ffffffffffffffb0,
                     CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8))
               ,(char *)this,in_stack_ffffffffffffff9c);
  bVar2 = ::roaring::Roaring64Map::addChecked
                    (in_stack_ffffffffffffffb0,
                     CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8)));
  iVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff9c);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8))
               ,(char *)this,iVar3);
  bVar2 = ::roaring::Roaring64Map::addChecked
                    (in_stack_ffffffffffffffb0,
                     CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8)));
  iVar3 = CONCAT13((char)((uint)iVar3 >> 0x18),CONCAT12(bVar2,(short)iVar3));
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8))
               ,(char *)this,iVar3);
  bVar2 = ::roaring::Roaring64Map::addChecked
                    (in_stack_ffffffffffffffb0,
                     CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8)));
  iVar3 = CONCAT22((short)((uint)iVar3 >> 0x10),CONCAT11(bVar2,(char)iVar3));
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(uVar1,in_stack_ffffffffffffffa8))
               ,(char *)this,iVar3);
  result = 0;
  test_roaring64_iterate_multi_roaring()::$_0::operator_cast_to_function_pointer
            ((__0 *)&stack0xffffffffffffffaf);
  ::roaring::Roaring64Map::iterate
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  _assert_true(result,(char *)CONCAT17(in_stack_ffffffffffffffaf,
                                       CONCAT16(uVar1,in_stack_ffffffffffffffa8)),(char *)this,iVar3
              );
  ::roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x104fa5);
  return;
}

Assistant:

void test_roaring64_iterate_multi_roaring(void) {
    Roaring64Map roaring;

    assert_true(roaring.addChecked(uint64_t(1)));
    assert_true(roaring.addChecked(uint64_t(2)));
    assert_true(roaring.addChecked(uint64_t(1) << 32));
    assert_true(roaring.addChecked(uint64_t(2) << 32));

    uint64_t iterate_count = 0;
    auto iterate_func = [](uint64_t, void *param) -> bool {
        auto *count = static_cast<uint64_t *>(param);
        *count += 1;
        return *count < 2;
    };
    roaring.iterate(iterate_func, &iterate_count);
    assert_true(iterate_count == 2);
}